

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  bool bVar1;
  int iVar2;
  cmGeneratorTarget *pcVar3;
  cmGlobalNinjaGenerator *pcVar4;
  cmMakefile *this_00;
  char *pcVar5;
  ulong uVar6;
  cmLocalNinjaGenerator *pcVar7;
  undefined4 extraout_var;
  pointer this_01;
  string *source;
  cmOutputConverter *local_c68;
  string local_b90;
  string local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  undefined1 local_b30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_1;
  string local_b10;
  undefined1 local_af0 [8];
  cmNinjaRule rule_2;
  string local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  undefined1 local_968 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string local_948;
  undefined1 local_928 [8];
  cmNinjaRule rule_1;
  string cmakeCommand;
  string local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a0;
  allocator<char> local_791;
  value_type local_790;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_770;
  const_iterator local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  reference local_738;
  string *linkCmd;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_6f0;
  char *local_6d0;
  char *val;
  string launcher;
  string langFlags;
  string local_668 [32];
  int local_648;
  int local_644;
  int minor;
  int major;
  ostringstream minorStream;
  ostringstream local_4c8 [8];
  ostringstream majorStream;
  string local_350 [8];
  string targetVersionMinor;
  string targetVersionMajor;
  char *flag;
  string cmakeLinkVar;
  undefined1 local_2e0 [8];
  string cmakeVarLang;
  string responseFlag;
  RuleVariables vars;
  undefined1 local_170 [8];
  cmNinjaRule rule;
  undefined1 local_38 [8];
  string linkRuleName;
  TargetType targetType;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  linkRuleName.field_2._M_local_buf[0xf] = useResponseFile;
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  linkRuleName.field_2._8_4_ = cmGeneratorTarget::GetType(pcVar3);
  LanguageLinkerRule_abi_cxx11_((string *)local_38,this);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar4,(string *)local_38);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&vars.SwiftSources,(string *)local_38);
    cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_170,(string *)&vars.SwiftSources);
    std::__cxx11::string::~string((string *)&vars.SwiftSources);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&responseFlag.field_2 + 8));
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    responseFlag.field_2._8_8_ = std::__cxx11::string::c_str();
    vars.CMTargetName = cmState::GetTargetTypeName(linkRuleName.field_2._8_4_);
    vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
    bVar1 = std::operator==(&this->TargetLinkLanguage,"Swift");
    if (bVar1) {
      vars.FilterPrefix = "$SWIFT_LIBRARY_NAME";
      vars.SwiftLibraryName = "$SWIFT_MODULE";
      vars.SwiftModule = "$SWIFT_MODULE_NAME";
      vars.SwiftModuleName = "$SWIFT_OUTPUT_FILE_MAP";
      vars.SwiftOutputFileMap = "$SWIFT_SOURCES";
      vars.LanguageCompileFlags = "$DEFINES";
      vars.ObjectFileDir = "$FLAGS";
      vars.Defines = "$INCLUDES";
    }
    std::__cxx11::string::string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2e0,"CMAKE_",
               (allocator<char> *)(cmakeLinkVar.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(cmakeLinkVar.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_2e0,(string *)&this->TargetLinkLanguage);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                   "_RESPONSE_FILE_LINK_FLAG");
    this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    pcVar5 = cmMakefile::GetDefinition(this_00,(string *)&flag);
    if (pcVar5 == (char *)0x0) {
      bVar1 = std::operator!=(&this->TargetLinkLanguage,"CUDA");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),"@");
      }
    }
    else {
      std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),pcVar5);
    }
    if (((linkRuleName.field_2._M_local_buf[0xf] & 1U) == 0) ||
       (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
      vars.Language = "$in";
      vars.Target = "$LINK_PATH $LINK_LIBRARIES";
    }
    else {
      std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE")
      ;
      std::__cxx11::string::operator+=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),
                 (string *)(rule.DepType.field_2._M_local_buf + 8));
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar4);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in_newline");
      }
      std::__cxx11::string::operator+=
                ((string *)(rule.RspFile.field_2._M_local_buf + 8)," $LINK_PATH $LINK_LIBRARIES");
      bVar1 = std::operator==(&this->TargetLinkLanguage,"Swift");
      if (bVar1) {
        vars.SwiftOutputFileMap = (char *)std::__cxx11::string::c_str();
      }
      else {
        vars.Language = (char *)std::__cxx11::string::c_str();
      }
      vars.Target = "";
    }
    vars.Object = "$OBJECT_DIR";
    vars.Objects = "$TARGET_FILE";
    vars.ObjectsQuoted = "$SONAME_FLAG";
    vars.SONameFlag = "$SONAME";
    vars.TargetSOName = "$INSTALLNAME_DIR";
    vars.CMTargetType = "$TARGET_PDB";
    std::__cxx11::string::string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_350);
    std::__cxx11::ostringstream::ostringstream(local_4c8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&minor);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetTargetVersion(pcVar3,&local_644,&local_648);
    std::ostream::operator<<(local_4c8,local_644);
    std::ostream::operator<<(&minor,local_648);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)(targetVersionMinor.field_2._M_local_buf + 8),local_668);
    std::__cxx11::string::~string(local_668);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_350,(string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&minor);
    std::__cxx11::ostringstream::~ostringstream(local_4c8);
    vars.TargetCompilePDB = (char *)std::__cxx11::string::c_str();
    vars.TargetVersionMajor = (char *)std::__cxx11::string::c_str();
    vars.ObjectFileDir = "$FLAGS";
    vars.TargetInstallNameDir = "$LINK_FLAGS";
    vars.LinkFlags = "$MANIFESTS";
    std::__cxx11::string::string((string *)(launcher.field_2._M_local_buf + 8));
    if (linkRuleName.field_2._8_4_ != 0) {
      std::__cxx11::string::operator+=
                ((string *)(launcher.field_2._M_local_buf + 8),"$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS"
                );
      vars.Manifests = (char *)std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)&val);
    pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f0,"RULE_LAUNCH_LINK",
               (allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    pcVar5 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar7,pcVar3,&local_6f0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    local_6d0 = pcVar5;
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      std::__cxx11::string::operator=((string *)&val,pcVar5);
      std::__cxx11::string::operator+=((string *)&val," ");
    }
    pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    iVar2 = (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&linkCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (pointer)CONCAT44(extraout_var,iVar2));
    ComputeLinkCmd_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,this);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    linkCmd = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&linkCmd), bVar1) {
      local_738 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      std::operator+(&local_758,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     local_738);
      std::__cxx11::string::operator=((string *)local_738,(string *)&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      this_01 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&linkCmds.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_c68 = (cmOutputConverter *)0x0;
      if (pcVar7 != (cmLocalNinjaGenerator *)0x0) {
        local_c68 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,local_c68,local_738,(RuleVariables *)((long)&responseFlag.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&__range2);
    local_770._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_768,&local_770);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"$PRE_LINK",&local_791);
    local_7a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2,local_768,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator(&local_791);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
               (char (*) [12])"$POST_BUILD");
    pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::string::string((string *)(cmakeCommand.field_2._M_local_buf + 8));
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_7c0,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,(string *)(cmakeCommand.field_2._M_local_buf + 8),
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)(cmakeCommand.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)(rule.Description.field_2._M_local_buf + 8),"Rule for linking ");
    std::__cxx11::string::operator+=
              ((string *)(rule.Description.field_2._M_local_buf + 8),
               (string *)&this->TargetLinkLanguage);
    std::__cxx11::string::operator+=((string *)(rule.Description.field_2._M_local_buf + 8)," ");
    pcVar5 = GetVisibleTypeName(this);
    std::__cxx11::string::operator+=((string *)(rule.Description.field_2._M_local_buf + 8),pcVar5);
    std::__cxx11::string::operator+=((string *)(rule.Description.field_2._M_local_buf + 8),".");
    std::__cxx11::string::operator=((string *)(rule.Command.field_2._M_local_buf + 8),"Linking ");
    std::__cxx11::string::operator+=
              ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)&this->TargetLinkLanguage
              );
    std::__cxx11::string::operator+=((string *)(rule.Command.field_2._M_local_buf + 8)," ");
    pcVar5 = GetVisibleTypeName(this);
    std::__cxx11::string::operator+=((string *)(rule.Command.field_2._M_local_buf + 8),pcVar5);
    std::__cxx11::string::operator+=
              ((string *)(rule.Command.field_2._M_local_buf + 8)," $TARGET_FILE");
    std::__cxx11::string::operator=((string *)(rule.RspContent.field_2._M_local_buf + 8),"$RESTAT");
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_170);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&flag);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_170);
  }
  bVar1 = std::operator!=(&(this->TargetNames).Output,&(this->TargetNames).Real);
  if (bVar1) {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsFrameworkOnApple(pcVar3);
    if (!bVar1) {
      pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&rule_1.Generator,
                 &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      if (linkRuleName.field_2._8_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_948,"CMAKE_SYMLINK_EXECUTABLE",
                   (allocator<char> *)
                   ((long)&cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_928,&local_948);
        std::__cxx11::string::~string((string *)&local_948);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmd.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_968);
        std::operator+(&local_988,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rule_1.Generator," -E cmake_symlink_executable $in $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_968,&local_988);
        std::__cxx11::string::~string((string *)&local_988);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_968,
                   (char (*) [12])"$POST_BUILD");
        pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&rule_2.Generator);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_9a8,pcVar7,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_968,(string *)&rule_2.Generator,(cmGeneratorTarget *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Name.field_2._M_local_buf + 8),(string *)&local_9a8);
        std::__cxx11::string::~string((string *)&local_9a8);
        std::__cxx11::string::~string((string *)&rule_2.Generator);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_968);
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Command.field_2._M_local_buf + 8),
                   "Creating executable symlink $out");
        std::__cxx11::string::operator=
                  ((string *)(rule_1.Description.field_2._M_local_buf + 8),
                   "Rule for creating executable symlink.");
        pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_928);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_928);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b10,"CMAKE_SYMLINK_LIBRARY",
                   (allocator<char> *)
                   ((long)&cmd_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_af0,&local_b10);
        std::__cxx11::string::~string((string *)&local_b10);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&cmd_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b30);
        std::operator+(&local_b50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rule_1.Generator," -E cmake_symlink_library $in $SONAME $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b30,&local_b50);
        std::__cxx11::string::~string((string *)&local_b50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[12]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b30,
                   (char (*) [12])"$POST_BUILD");
        pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        std::__cxx11::string::string((string *)&local_b90);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_b70,pcVar7,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b30,&local_b90,(cmGeneratorTarget *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Name.field_2._M_local_buf + 8),(string *)&local_b70);
        std::__cxx11::string::~string((string *)&local_b70);
        std::__cxx11::string::~string((string *)&local_b90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b30);
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Command.field_2._M_local_buf + 8),
                   "Creating library symlink $out");
        std::__cxx11::string::operator=
                  ((string *)(rule_2.Description.field_2._M_local_buf + 8),
                   "Rule for creating library symlink.");
        pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_af0);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_af0);
      }
      std::__cxx11::string::~string((string *)&rule_1.Generator);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule();
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);

    vars.Language = this->TargetLinkLanguage.c_str();

    if (this->TargetLinkLanguage == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftOutputFileMap = "$SWIFT_OUTPUT_FILE_MAP";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang = "CMAKE_";
    cmakeVarLang += this->TargetLinkLanguage;

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = flag;
    } else if (this->TargetLinkLanguage != "CUDA") {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
      if (this->TargetLinkLanguage == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    rule.Comment = "Rule for linking ";
    rule.Comment += this->TargetLinkLanguage;
    rule.Comment += " ";
    rule.Comment += this->GetVisibleTypeName();
    rule.Comment += ".";
    rule.Description = "Linking ";
    rule.Description += this->TargetLinkLanguage;
    rule.Description += " ";
    rule.Description += this->GetVisibleTypeName();
    rule.Description += " $TARGET_FILE";
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (this->TargetNames.Output != this->TargetNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command = this->GetLocalGenerator()->BuildCommandLine(cmd);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command = this->GetLocalGenerator()->BuildCommandLine(cmd);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }
}